

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProceduralBlockVisitor.hpp
# Opt level: O1

void __thiscall
netlist::ProceduralBlockVisitor::connectVarToDecl
          (ProceduralBlockVisitor *this,NetlistVariableReference *varNode,Symbol *symbol)

{
  Netlist *this_00;
  NetlistVariableDeclaration *targetNode;
  string_view hierarchicalPath;
  string local_38;
  
  this_00 = this->netlist;
  resolveSymbolHierPath_abi_cxx11_(&local_38,(netlist *)symbol,symbol);
  hierarchicalPath._M_str = local_38._M_dataplus._M_p;
  hierarchicalPath._M_len = local_38._M_string_length;
  targetNode = Netlist::lookupVariable(this_00,hierarchicalPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  Node<netlist::NetlistNode,_netlist::NetlistEdge>::addEdge
            ((Node<netlist::NetlistNode,_netlist::NetlistEdge> *)varNode,
             &targetNode->super_NetlistNode);
  return;
}

Assistant:

void connectVarToDecl(NetlistVariableReference& varNode, ast::Symbol const& symbol) {
        auto* declNode = netlist.lookupVariable(resolveSymbolHierPath(symbol));
        netlist.addEdge(varNode, *declNode);
        DEBUG_PRINT("New edge: reference {} -> declaration {}\n", varNode.getName(),
                    declNode->hierarchicalPath);
    }